

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeArrayConstructor
               (DynamicObject *arrayConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  PropertyString *pPVar1;
  ScriptContext *pSVar2;
  
  DeferredTypeHandlerBase::Convert(typeHandler,arrayConstructor,mode,6,0);
  this = (((arrayConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar2 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(arrayConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayConstructor,0xd1,&DAT_1000000000001,2,0,0,0);
  (*(arrayConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (arrayConstructor,0x124,
             (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             arrayPrototype.ptr,0,0,0,0);
  AddSpeciesAccessorsToLibraryObject
            (this,arrayConstructor,(FunctionInfo *)JavascriptArray::EntryInfo::GetterSymbolSpecies);
  pPVar1 = ScriptContext::GetPropertyString(pSVar2,0x4f);
  (*(arrayConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayConstructor,0x106,pPVar1,2,0,0,0);
  (*(arrayConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayConstructor,0xbe,(this->isArrayFunction).ptr,6,0,0,0);
  AddFunctionToLibraryObject
            (this,arrayConstructor,0x95,(FunctionInfo *)JavascriptArray::EntryInfo::From,1,'\x06');
  pSVar2 = (ScriptContext *)arrayConstructor;
  AddFunctionToLibraryObject
            (this,arrayConstructor,0x11c,(FunctionInfo *)JavascriptArray::EntryInfo::Of,0,'\x06');
  CheckRegisteredBuiltIns((Type *)&this->field_0x650,pSVar2);
  DynamicObject::SetHasNoEnumerableProperties(arrayConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeArrayConstructor(DynamicObject* arrayConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(arrayConstructor, mode, 6);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterArray
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = arrayConstructor->GetScriptContext();
        JavascriptLibrary* library = arrayConstructor->GetLibrary();
        Field(JavascriptFunction*)* builtinFuncs = library->GetBuiltinFunctions();

        library->AddMember(arrayConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(arrayConstructor, PropertyIds::prototype, scriptContext->GetLibrary()->arrayPrototype, PropertyNone);
        library->AddSpeciesAccessorsToLibraryObject(arrayConstructor, &JavascriptArray::EntryInfo::GetterSymbolSpecies);
        library->AddMember(arrayConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Array), PropertyConfigurable);

#ifdef ENABLE_JS_BUILTINS
        library->AddMember(arrayConstructor, PropertyIds::isArray, library->isArrayFunction);
#else
        library->AddFunctionToLibraryObject(arrayConstructor, PropertyIds::isArray, &JavascriptArray::EntryInfo::IsArray, 1);
#endif

        library->AddFunctionToLibraryObject(arrayConstructor, PropertyIds::from, &JavascriptArray::EntryInfo::From, 1);
        library->AddFunctionToLibraryObject(arrayConstructor, PropertyIds::of, &JavascriptArray::EntryInfo::Of, 0);

        DebugOnly(CheckRegisteredBuiltIns(builtinFuncs, scriptContext));

        arrayConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }